

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void rlib::operator<<(std::ostream&,rlib::JsonT<void>::Stringify_const&)::F::f(std::ostream&,rlib::
     JsonT<void>const&,rlib::JsonT<void>::Stringify::Format_const&,std::__cxx11::string_const__
               (ostream *os,JsonT<void> *j,Format *f,string *depth)

{
  bool bVar1;
  Type TVar2;
  void *this;
  ostream *poVar3;
  pointer ppVar4;
  Format *in_RCX;
  JsonT<void> *in_RDX;
  JsonT<void> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000098;
  const_iterator it_1;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  JsonT<void> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  _Self local_e8;
  _Self local_e0;
  _Self local_d8;
  JsonT<void> *local_d0;
  string local_c8 [32];
  JsonT<void> *local_a8;
  JsonT<void> *local_a0;
  __normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
  local_98 [3];
  string local_80 [32];
  string local_60 [32];
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  TVar2 = rlib::JsonT<void>::type(in_RSI);
  switch(TVar2) {
  case Null:
    std::operator<<((ostream *)in_RDI,"null");
    break;
  case Bool:
    this = (void *)std::ostream::operator<<(in_RDI,std::boolalpha);
    std::ostream::operator<<(this,(bool)((in_RSI->field_1).m_bool & 1));
    break;
  case Float:
    std::ostream::operator<<(in_RDI,(in_RSI->field_1).m_float);
    break;
  case Int:
    std::ostream::operator<<(in_RDI,(in_RSI->field_1).m_int);
    break;
  case String:
    escape(std::__cxx11::string_const__(in_stack_00000098);
    std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
    std::operator<<((ostream *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    break;
  case Array:
    poVar3 = std::operator<<((ostream *)in_RDI,"[");
    std::operator<<(poVar3,(string *)in_RDX);
    local_98[0]._M_current =
         (JsonT<void> *)
         std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::cbegin
                   ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
                    in_stack_fffffffffffffe08);
    while( true ) {
      local_a0 = (JsonT<void> *)
                 std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::cend
                           ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
                            in_stack_fffffffffffffe08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
                          *)in_stack_fffffffffffffe10,
                         (__normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
                          *)in_stack_fffffffffffffe08);
      if (!bVar1) break;
      local_a8 = (JsonT<void> *)
                 std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::cbegin
                           ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
                            in_stack_fffffffffffffe08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
                          *)in_stack_fffffffffffffe10,
                         (__normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
                          *)in_stack_fffffffffffffe08);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)in_RDI,",");
        std::operator<<(poVar3,(string *)in_RDX);
      }
      poVar3 = std::operator<<((ostream *)in_RDI,(string *)in_RCX);
      std::operator<<(poVar3,(string *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&(in_RDX->field_1).m_map._M_t._M_impl.super__Rb_tree_header + 1));
      pbVar5 = in_RDI;
      __gnu_cxx::
      __normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
      ::operator*(local_98);
      std::operator+(pbVar5,in_stack_fffffffffffffe30);
      string_const__((ostream *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      std::__cxx11::string::~string(local_c8);
      local_d0 = (JsonT<void> *)
                 __gnu_cxx::
                 __normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
                 ::operator++((__normal_iterator<const_rlib::JsonT<void>_*,_std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>_>
                               *)in_stack_fffffffffffffe18,
                              (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    }
    poVar3 = std::operator<<((ostream *)in_RDI,(string *)in_RDX);
    poVar3 = std::operator<<(poVar3,(string *)in_RCX);
    std::operator<<(poVar3,"]");
    break;
  case Map:
    poVar3 = std::operator<<((ostream *)in_RDI,"{");
    std::operator<<(poVar3,(string *)in_RDX);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
         ::cbegin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                   *)in_stack_fffffffffffffe08);
    while( true ) {
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
           ::cend((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                   *)in_stack_fffffffffffffe08);
      bVar1 = std::operator!=(&local_d8,&local_e0);
      if (!bVar1) break;
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
           ::cbegin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                     *)in_stack_fffffffffffffe08);
      bVar1 = std::operator!=(&local_d8,&local_e8);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)in_RDI,",");
        std::operator<<(poVar3,(string *)in_RDX);
      }
      poVar3 = std::operator<<((ostream *)in_RDI,(string *)in_RCX);
      std::operator<<(poVar3,(string *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&(in_RDX->field_1).m_map._M_t._M_impl.super__Rb_tree_header + 1));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>
                    *)0x169761);
      pbVar5 = &local_168;
      escape(std::__cxx11::string_const__(in_stack_00000098);
      std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::operator<<((ostream *)in_RDI,local_108);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string((string *)&local_168);
      in_stack_fffffffffffffe08 = in_RDI;
      in_stack_fffffffffffffe18 = in_RDX;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>
                             *)0x169833);
      in_stack_fffffffffffffe10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppVar4->second;
      in_RDX = in_stack_fffffffffffffe18;
      std::operator+(in_stack_fffffffffffffe38,pbVar5);
      string_const__((ostream *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      std::__cxx11::string::~string(local_188);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>
                    *)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    }
    poVar3 = std::operator<<((ostream *)in_RDI,(string *)in_RDX);
    poVar3 = std::operator<<(poVar3,(string *)in_RCX);
    std::operator<<(poVar3,"}");
  }
  return;
}

Assistant:

static void f(std::ostream& os, const JsonT& j, const typename Stringify::Format& f, const std::string& depth) {
					switch (j.type()) {
					case Type::Null:
						os << "null";
						break;
					case Type::Bool:
						os << std::boolalpha << j.m_bool;
						break;
					case Type::Float:
						os << j.m_float;
						break;
					case Type::Int:
						os << j.m_int;
						break;
					case Type::String:
						os << "\"" + escape(j.m_string) + "\"";
						break;
					case Type::Array:
						os << "[" << f.lf;
						for (auto it = j.m_array.cbegin(); it != j.m_array.cend(); it++) {
							if (it != j.m_array.cbegin()) os << "," << f.lf;
							os << depth << f.indent;
							F::f(os, *it, f, depth + f.indent);
						}
						os << f.lf << depth << "]";
						break;
					case Type::Map:
						os << "{" << f.lf;
						for (auto it = j.m_map.cbegin(); it != j.m_map.cend(); it++) {
							if (it != j.m_map.cbegin()) os << "," << f.lf;
							os << depth << f.indent;
							os << "\"" + escape(it->first) + "\"" + f.colon;
							F::f(os, it->second, f, depth + f.indent);
						}
						os << f.lf << depth << "}";
						break;
					default:
						assert(false);
					}
				}